

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::CoverpointSyntax::CoverpointSyntax
          (CoverpointSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          DataTypeSyntax *type,NamedLabelSyntax *label,Token coverpoint,ExpressionSyntax *expr,
          CoverageIffClauseSyntax *iff,Token openBrace,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token closeBrace,Token emptySemi)

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = coverpoint._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = Coverpoint;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (this->type).ptr = type;
  this->label = label;
  (this->coverpoint).kind = (short)uVar7;
  (this->coverpoint).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->coverpoint).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->coverpoint).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->coverpoint).info = coverpoint.info;
  (this->expr).ptr = expr;
  this->iff = iff;
  (this->openBrace).kind = openBrace.kind;
  (this->openBrace).field_0x2 = openBrace._2_1_;
  (this->openBrace).numFlags = (NumericTokenFlags)openBrace.numFlags.raw;
  (this->openBrace).rawLen = openBrace.rawLen;
  (this->openBrace).info = openBrace.info;
  SVar4 = (members->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
       (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar1 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed010;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  (this->emptySemi).kind = emptySemi.kind;
  (this->emptySemi).field_0x2 = emptySemi._2_1_;
  (this->emptySemi).numFlags = (NumericTokenFlags)emptySemi.numFlags.raw;
  (this->emptySemi).rawLen = emptySemi.rawLen;
  (this->emptySemi).info = emptySemi.info;
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (label != (NamedLabelSyntax *)0x0) {
    (label->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (expr->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (iff != (CoverageIffClauseSyntax *)0x0) {
    (iff->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppMVar3 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppMVar3 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  return;
}

Assistant:

CoverpointSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, DataTypeSyntax& type, NamedLabelSyntax* label, Token coverpoint, ExpressionSyntax& expr, CoverageIffClauseSyntax* iff, Token openBrace, const SyntaxList<MemberSyntax>& members, Token closeBrace, Token emptySemi) :
        MemberSyntax(SyntaxKind::Coverpoint, attributes), type(&type), label(label), coverpoint(coverpoint), expr(&expr), iff(iff), openBrace(openBrace), members(members), closeBrace(closeBrace), emptySemi(emptySemi) {
        this->type->parent = this;
        if (this->label) this->label->parent = this;
        this->expr->parent = this;
        if (this->iff) this->iff->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }